

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O2

void BinaryCache::PutBytecode(char *path,char *bytecode,Lexeme *lexStart,uint lexCount)

{
  uint uVar1;
  CodeDescriptor *pCVar2;
  size_t sVar3;
  char *__dest;
  Lexeme *__dest_00;
  uint index;
  
  uVar1 = NULLC::GetStringHash(path);
  if (uVar1 != lastHash) {
    index = 0;
    while ((index < DAT_00243f64 &&
           (pCVar2 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                               ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)&cache,
                                index), uVar1 != pCVar2->nameHash))) {
      index = index + 1;
    }
    if (DAT_00243f64 != index) {
      __assert_fail("i == cache.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/BinaryCache.cpp"
                    ,0x69,
                    "void BinaryCache::PutBytecode(const char *, const char *, Lexeme *, unsigned int)"
                   );
    }
    pCVar2 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::push_back
                       ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)&cache);
    sVar3 = strlen(path);
    __dest = (char *)(*(code *)NULLC::alloc)((int)sVar3 + 1);
    strcpy(__dest,path);
    pCVar2->name = __dest;
    pCVar2->nameHash = uVar1;
    pCVar2->binary = bytecode;
    if (lexStart == (Lexeme *)0x0) {
      pCVar2->lexemes = (Lexeme *)0x0;
      lexCount = 0;
    }
    else {
      __dest_00 = (Lexeme *)operator_new__((ulong)lexCount << 5);
      pCVar2->lexemes = __dest_00;
      memcpy(__dest_00,lexStart,(ulong)lexCount << 5);
    }
    pCVar2->lexemeCount = lexCount;
  }
  return;
}

Assistant:

void BinaryCache::PutBytecode(const char* path, const char* bytecode, Lexeme* lexStart, unsigned lexCount)
{
	unsigned int hash = NULLC::GetStringHash(path);

	if(hash == lastHash)
		return;

	unsigned int i = 0;
	for(; i < cache.size(); i++)
	{
		if(hash == cache[i].nameHash)
			break;
	}
	assert(i == cache.size());

	BinaryCache::CodeDescriptor *desc = cache.push_back();
	unsigned int pathLen = (unsigned int)strlen(path);
	desc->name = strcpy((char*)NULLC::alloc(pathLen + 1), path);
	desc->nameHash = hash;
	desc->binary = bytecode;
	if(lexStart)
	{
		desc->lexemes = new Lexeme[lexCount];
		memcpy(desc->lexemes, lexStart, lexCount * sizeof(Lexeme));
		desc->lexemeCount = lexCount;
	}else{
		desc->lexemes = NULL;
		desc->lexemeCount = 0;
	}
}